

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gameplay.cpp
# Opt level: O3

void __thiscall Gameplay::finalPhase(Gameplay *this)

{
  Gameplay *pGVar1;
  long *plVar2;
  Stronghold *this_00;
  string *psVar3;
  ostream *poVar4;
  int iVar5;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"FINAL PHASE",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  ArrangeTurns(this);
  pGVar1 = (Gameplay *)
           (this->players).super__List_base<Player,_std::allocator<Player>_>._M_impl._M_node.
           super__List_node_base._M_next;
  (this->it)._M_node = (_List_node_base *)pGVar1;
  while (pGVar1 != this) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Players remaining: ",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Player ",7);
    this_00 = Player::getStronghold((Player *)((this->it)._M_node + 1));
    psVar3 = BlackCard::getName_abi_cxx11_(&this_00->super_BlackCard);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    Player::discardSurplusFateCards((Player *)((this->it)._M_node + 1));
    pGVar1 = (Gameplay *)((this->it)._M_node)->_M_next;
    (this->it)._M_node = (_List_node_base *)pGVar1;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Stats: ",7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  pGVar1 = (Gameplay *)
           (this->players).super__List_base<Player,_std::allocator<Player>_>._M_impl._M_node.
           super__List_node_base._M_next;
  (this->it)._M_node = (_List_node_base *)pGVar1;
  if (pGVar1 != this) {
    iVar5 = 1;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Player ",7);
      plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar5);
      std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
      std::ostream::put((char)plVar2);
      std::ostream::flush();
      Player::PrintPlayerStats((Player *)((this->it)._M_node + 1));
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      std::ostream::put(-8);
      std::ostream::flush();
      iVar5 = iVar5 + 1;
      pGVar1 = (Gameplay *)((this->it)._M_node)->_M_next;
      (this->it)._M_node = (_List_node_base *)pGVar1;
    } while (pGVar1 != this);
  }
  return;
}

Assistant:

void Gameplay::finalPhase()                                     //phase5: discarding extra hand cards and printing game stats
{
    cout << "FINAL PHASE" << endl <<endl;
    this->ArrangeTurns();

    for (it=players.begin(); it!=players.end(); it++)
    {
        cout <<"Players remaining: "<<endl;
        cout << "Player " << it->getStronghold()->getName() << endl;
        it->discardSurplusFateCards();
    }

    //print game stats
    cout << "Stats: "<<endl;
    int count=1;
    for (it=players.begin(); it!=players.end(); it++)
    {
        cout << "Player " << count << endl;
        it->PrintPlayerStats();
        cout << endl;

        count++;
    }
}